

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AssbinLoader.cpp
# Opt level: O3

aiColor3D Read<aiColor3D>(IOStream *stream)

{
  long lVar1;
  runtime_error *this;
  long *in_RSI;
  undefined8 extraout_XMM0_Qa;
  ai_real in_XMM1_Da;
  aiColor3D aVar2;
  undefined1 *local_40 [2];
  undefined1 local_30 [16];
  
  stream->_vptr_IOStream = (_func_int **)0x0;
  *(undefined4 *)&stream[1]._vptr_IOStream = 0;
  lVar1 = (**(code **)(*in_RSI + 0x10))();
  if (lVar1 == 1) {
    aVar2.b = in_XMM1_Da;
    aVar2.r = (ai_real)(int)extraout_XMM0_Qa;
    aVar2.g = (ai_real)(int)((ulong)extraout_XMM0_Qa >> 0x20);
    return aVar2;
  }
  this = (runtime_error *)__cxa_allocate_exception(0x10);
  local_40[0] = local_30;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_40,"Unexpected EOF","");
  std::runtime_error::runtime_error(this,(string *)local_40);
  *(undefined ***)this = &PTR__runtime_error_008bf448;
  __cxa_throw(this,&DeadlyImportError::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

T Read(IOStream * stream) {
    T t;
    size_t res = stream->Read( &t, sizeof(T), 1 );
    if(res != 1)
        throw DeadlyImportError("Unexpected EOF");
    return t;
}